

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_process.c
# Opt level: O1

void ares_process_fd(ares_channel_t *channel,ares_socket_t read_fd,ares_socket_t write_fd)

{
  size_t nevents;
  ares_fd_events_t events [2];
  ares_socket_t aStack_20;
  byte abStack_1c [4];
  ares_fd_events_t local_18;
  undefined8 uStack_10;
  
  local_18.fd = 0;
  local_18.events = 0;
  uStack_10 = 0;
  if (read_fd != -1) {
    local_18.events._0_1_ = 1;
    local_18.fd = read_fd;
    local_18.events._1_3_ = 0;
  }
  nevents = (size_t)(read_fd != -1);
  if (write_fd != -1) {
    nevents = nevents + (write_fd != read_fd);
    (&aStack_20)[nevents * 2] = write_fd;
    abStack_1c[nevents * 8] = abStack_1c[nevents * 8] | 2;
  }
  _aStack_20 = 0x11401d;
  ares_process_fds(channel,&local_18,nevents,0);
  return;
}

Assistant:

void ares_process_fd(ares_channel_t *channel, ares_socket_t read_fd,
                     ares_socket_t write_fd)
{
  ares_fd_events_t events[2];
  size_t           nevents = 0;

  memset(events, 0, sizeof(events));

  if (read_fd != ARES_SOCKET_BAD) {
    nevents++;
    events[nevents - 1].fd      = read_fd;
    events[nevents - 1].events |= ARES_FD_EVENT_READ;
  }

  if (write_fd != ARES_SOCKET_BAD) {
    if (write_fd != read_fd) {
      nevents++;
    }
    events[nevents - 1].fd      = write_fd;
    events[nevents - 1].events |= ARES_FD_EVENT_WRITE;
  }

  ares_process_fds(channel, events, nevents, ARES_PROCESS_FLAG_NONE);
}